

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

CopyConst<char,_ElementType<1UL>_>_conflict16 * __thiscall
phmap::priv::internal_layout::
LayoutImpl<std::tuple<signed_char,cs_impl::any>,phmap::integer_sequence<unsigned_long,0ul,1ul>,phmap::integer_sequence<unsigned_long,0ul,1ul>>
::Pointer<1ul,char>(LayoutImpl<std::tuple<signed_char,_cs_impl::any>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>_>
                    *this,char *p)

{
  size_t sVar1;
  ulong in_RSI;
  LayoutImpl<std::tuple<signed_char,_cs_impl::any>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>_>
  *in_RDI;
  size_t alignment;
  
  if ((in_RSI & 7) == 0) {
    sVar1 = LayoutImpl<std::tuple<signed_char,_cs_impl::any>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>_>
            ::Offset<1UL,_0>(in_RDI);
    return (CopyConst<char,_ElementType<1UL>_>_conflict16 *)(in_RSI + sVar1);
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap_base.h"
                ,0x1074,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<signed char, cs_impl::any>, phmap::integer_sequence<unsigned long, 0, 1>, phmap::integer_sequence<unsigned long, 0, 1>>::Pointer(Char *) const [Elements = std::tuple<signed char, cs_impl::any>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1>, N = 1UL, Char = char]"
               );
}

Assistant:

CopyConst<Char, ElementType<N>>* Pointer(Char* p) const
				{
					using C = typename std::remove_const<Char>::type;
					static_assert(
					    std::is_same<C, char>() || std::is_same<C, unsigned char>() ||
					    std::is_same<C, signed char>(),
					    "The argument must be a pointer to [const] [signed|unsigned] char");
					constexpr size_t alignment = Alignment();
					(void)alignment;
					assert(reinterpret_cast<uintptr_t>(p) % alignment == 0);
					return reinterpret_cast<CopyConst<Char, ElementType<N>>*>(p + Offset<N>());
				}